

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t zeGetMemProcAddrTable(ze_api_version_t version,ze_mem_dditable_t *pDdiTable)

{
  ze_pfnMemAllocDevice_t p_Var1;
  ze_pfnMemFree_t p_Var2;
  ze_pfnMemGetAddressRange_t p_Var3;
  ze_pfnMemOpenIpcHandle_t p_Var4;
  ze_pfnMemFreeExt_t p_Var5;
  ze_pfnMemGetPitchFor2dImage_t p_Var6;
  ze_api_version_t *pzVar7;
  ze_result_t zVar8;
  
  pzVar7 = validation_layer::context;
  if (pDdiTable == (ze_mem_dditable_t *)0x0) {
    zVar8 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar8 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnAllocDevice;
      *(ze_pfnMemAllocShared_t *)(validation_layer::context + 0xee) = pDdiTable->pfnAllocShared;
      *(ze_pfnMemAllocDevice_t *)(pzVar7 + 0xf0) = p_Var1;
      pDdiTable->pfnAllocShared = validation_layer::zeMemAllocShared;
      pDdiTable->pfnAllocDevice = validation_layer::zeMemAllocDevice;
      p_Var2 = pDdiTable->pfnFree;
      *(ze_pfnMemAllocHost_t *)(pzVar7 + 0xf2) = pDdiTable->pfnAllocHost;
      *(ze_pfnMemFree_t *)(pzVar7 + 0xf4) = p_Var2;
      pDdiTable->pfnAllocHost = validation_layer::zeMemAllocHost;
      pDdiTable->pfnFree = validation_layer::zeMemFree;
      p_Var3 = pDdiTable->pfnGetAddressRange;
      *(ze_pfnMemGetAllocProperties_t *)(pzVar7 + 0xf6) = pDdiTable->pfnGetAllocProperties;
      *(ze_pfnMemGetAddressRange_t *)(pzVar7 + 0xf8) = p_Var3;
      pDdiTable->pfnGetAllocProperties = validation_layer::zeMemGetAllocProperties;
      pDdiTable->pfnGetAddressRange = validation_layer::zeMemGetAddressRange;
      p_Var4 = pDdiTable->pfnOpenIpcHandle;
      *(ze_pfnMemGetIpcHandle_t *)(pzVar7 + 0xfa) = pDdiTable->pfnGetIpcHandle;
      *(ze_pfnMemOpenIpcHandle_t *)(pzVar7 + 0xfc) = p_Var4;
      pDdiTable->pfnGetIpcHandle = validation_layer::zeMemGetIpcHandle;
      pDdiTable->pfnOpenIpcHandle = validation_layer::zeMemOpenIpcHandle;
      p_Var5 = pDdiTable->pfnFreeExt;
      *(ze_pfnMemCloseIpcHandle_t *)(pzVar7 + 0xfe) = pDdiTable->pfnCloseIpcHandle;
      *(ze_pfnMemFreeExt_t *)(pzVar7 + 0x100) = p_Var5;
      pDdiTable->pfnCloseIpcHandle = validation_layer::zeMemCloseIpcHandle;
      pDdiTable->pfnFreeExt = validation_layer::zeMemFreeExt;
      p_Var6 = pDdiTable->pfnGetPitchFor2dImage;
      *(ze_pfnMemPutIpcHandle_t *)(pzVar7 + 0x102) = pDdiTable->pfnPutIpcHandle;
      *(ze_pfnMemGetPitchFor2dImage_t *)(pzVar7 + 0x104) = p_Var6;
      pDdiTable->pfnPutIpcHandle = validation_layer::zeMemPutIpcHandle;
      pDdiTable->pfnGetPitchFor2dImage = validation_layer::zeMemGetPitchFor2dImage;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar8;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_dditable_t* pDdiTable                    ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.Mem;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnAllocShared                              = pDdiTable->pfnAllocShared;
    pDdiTable->pfnAllocShared                            = validation_layer::zeMemAllocShared;

    dditable.pfnAllocDevice                              = pDdiTable->pfnAllocDevice;
    pDdiTable->pfnAllocDevice                            = validation_layer::zeMemAllocDevice;

    dditable.pfnAllocHost                                = pDdiTable->pfnAllocHost;
    pDdiTable->pfnAllocHost                              = validation_layer::zeMemAllocHost;

    dditable.pfnFree                                     = pDdiTable->pfnFree;
    pDdiTable->pfnFree                                   = validation_layer::zeMemFree;

    dditable.pfnGetAllocProperties                       = pDdiTable->pfnGetAllocProperties;
    pDdiTable->pfnGetAllocProperties                     = validation_layer::zeMemGetAllocProperties;

    dditable.pfnGetAddressRange                          = pDdiTable->pfnGetAddressRange;
    pDdiTable->pfnGetAddressRange                        = validation_layer::zeMemGetAddressRange;

    dditable.pfnGetIpcHandle                             = pDdiTable->pfnGetIpcHandle;
    pDdiTable->pfnGetIpcHandle                           = validation_layer::zeMemGetIpcHandle;

    dditable.pfnOpenIpcHandle                            = pDdiTable->pfnOpenIpcHandle;
    pDdiTable->pfnOpenIpcHandle                          = validation_layer::zeMemOpenIpcHandle;

    dditable.pfnCloseIpcHandle                           = pDdiTable->pfnCloseIpcHandle;
    pDdiTable->pfnCloseIpcHandle                         = validation_layer::zeMemCloseIpcHandle;

    dditable.pfnFreeExt                                  = pDdiTable->pfnFreeExt;
    pDdiTable->pfnFreeExt                                = validation_layer::zeMemFreeExt;

    dditable.pfnPutIpcHandle                             = pDdiTable->pfnPutIpcHandle;
    pDdiTable->pfnPutIpcHandle                           = validation_layer::zeMemPutIpcHandle;

    dditable.pfnGetPitchFor2dImage                       = pDdiTable->pfnGetPitchFor2dImage;
    pDdiTable->pfnGetPitchFor2dImage                     = validation_layer::zeMemGetPitchFor2dImage;

    return result;
}